

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

void RGB24PackedToPlanarHelper_SSE2(__m128i *in,__m128i *out)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  longlong lVar15;
  
  uVar1 = *(undefined1 *)((long)*in + 1);
  uVar2 = *(undefined1 *)((long)*in + 2);
  uVar3 = *(undefined1 *)((long)*in + 3);
  uVar4 = *(undefined1 *)((long)*in + 4);
  uVar5 = *(undefined1 *)((long)*in + 5);
  uVar6 = *(undefined1 *)((long)*in + 6);
  uVar7 = *(undefined1 *)((long)*in + 7);
  lVar15 = in[3][0];
  uVar8 = *(undefined1 *)((long)in[3] + 1);
  uVar9 = *(undefined1 *)((long)in[3] + 2);
  uVar10 = *(undefined1 *)((long)in[3] + 3);
  uVar11 = *(undefined1 *)((long)in[3] + 4);
  uVar12 = *(undefined1 *)((long)in[3] + 5);
  uVar13 = *(undefined1 *)((long)in[3] + 6);
  uVar14 = *(undefined1 *)((long)in[3] + 7);
  *(char *)*out = (char)(*in)[0];
  *(char *)((long)*out + 1) = (char)lVar15;
  *(undefined1 *)((long)*out + 2) = uVar1;
  *(undefined1 *)((long)*out + 3) = uVar8;
  *(undefined1 *)((long)*out + 4) = uVar2;
  *(undefined1 *)((long)*out + 5) = uVar9;
  *(undefined1 *)((long)*out + 6) = uVar3;
  *(undefined1 *)((long)*out + 7) = uVar10;
  *(undefined1 *)(*out + 1) = uVar4;
  *(undefined1 *)((long)*out + 9) = uVar11;
  *(undefined1 *)((long)*out + 10) = uVar5;
  *(undefined1 *)((long)*out + 0xb) = uVar12;
  *(undefined1 *)((long)*out + 0xc) = uVar6;
  *(undefined1 *)((long)*out + 0xd) = uVar13;
  *(undefined1 *)((long)*out + 0xe) = uVar7;
  *(undefined1 *)((long)*out + 0xf) = uVar14;
  uVar1 = *(undefined1 *)((long)*in + 9);
  uVar2 = *(undefined1 *)((long)*in + 10);
  uVar3 = *(undefined1 *)((long)*in + 0xb);
  uVar4 = *(undefined1 *)((long)*in + 0xc);
  uVar5 = *(undefined1 *)((long)*in + 0xd);
  uVar6 = *(undefined1 *)((long)*in + 0xe);
  uVar7 = *(undefined1 *)((long)*in + 0xf);
  lVar15 = in[3][1];
  uVar8 = *(undefined1 *)((long)in[3] + 9);
  uVar9 = *(undefined1 *)((long)in[3] + 10);
  uVar10 = *(undefined1 *)((long)in[3] + 0xb);
  uVar11 = *(undefined1 *)((long)in[3] + 0xc);
  uVar12 = *(undefined1 *)((long)in[3] + 0xd);
  uVar13 = *(undefined1 *)((long)in[3] + 0xe);
  uVar14 = *(undefined1 *)((long)in[3] + 0xf);
  *(char *)out[1] = (char)(*in)[1];
  *(char *)((long)out[1] + 1) = (char)lVar15;
  *(undefined1 *)((long)out[1] + 2) = uVar1;
  *(undefined1 *)((long)out[1] + 3) = uVar8;
  *(undefined1 *)((long)out[1] + 4) = uVar2;
  *(undefined1 *)((long)out[1] + 5) = uVar9;
  *(undefined1 *)((long)out[1] + 6) = uVar3;
  *(undefined1 *)((long)out[1] + 7) = uVar10;
  *(undefined1 *)(out[1] + 1) = uVar4;
  *(undefined1 *)((long)out[1] + 9) = uVar11;
  *(undefined1 *)((long)out[1] + 10) = uVar5;
  *(undefined1 *)((long)out[1] + 0xb) = uVar12;
  *(undefined1 *)((long)out[1] + 0xc) = uVar6;
  *(undefined1 *)((long)out[1] + 0xd) = uVar13;
  *(undefined1 *)((long)out[1] + 0xe) = uVar7;
  *(undefined1 *)((long)out[1] + 0xf) = uVar14;
  uVar1 = *(undefined1 *)((long)in[1] + 1);
  uVar2 = *(undefined1 *)((long)in[1] + 2);
  uVar3 = *(undefined1 *)((long)in[1] + 3);
  uVar4 = *(undefined1 *)((long)in[1] + 4);
  uVar5 = *(undefined1 *)((long)in[1] + 5);
  uVar6 = *(undefined1 *)((long)in[1] + 6);
  uVar7 = *(undefined1 *)((long)in[1] + 7);
  lVar15 = in[4][0];
  uVar8 = *(undefined1 *)((long)in[4] + 1);
  uVar9 = *(undefined1 *)((long)in[4] + 2);
  uVar10 = *(undefined1 *)((long)in[4] + 3);
  uVar11 = *(undefined1 *)((long)in[4] + 4);
  uVar12 = *(undefined1 *)((long)in[4] + 5);
  uVar13 = *(undefined1 *)((long)in[4] + 6);
  uVar14 = *(undefined1 *)((long)in[4] + 7);
  *(char *)out[2] = (char)in[1][0];
  *(char *)((long)out[2] + 1) = (char)lVar15;
  *(undefined1 *)((long)out[2] + 2) = uVar1;
  *(undefined1 *)((long)out[2] + 3) = uVar8;
  *(undefined1 *)((long)out[2] + 4) = uVar2;
  *(undefined1 *)((long)out[2] + 5) = uVar9;
  *(undefined1 *)((long)out[2] + 6) = uVar3;
  *(undefined1 *)((long)out[2] + 7) = uVar10;
  *(undefined1 *)(out[2] + 1) = uVar4;
  *(undefined1 *)((long)out[2] + 9) = uVar11;
  *(undefined1 *)((long)out[2] + 10) = uVar5;
  *(undefined1 *)((long)out[2] + 0xb) = uVar12;
  *(undefined1 *)((long)out[2] + 0xc) = uVar6;
  *(undefined1 *)((long)out[2] + 0xd) = uVar13;
  *(undefined1 *)((long)out[2] + 0xe) = uVar7;
  *(undefined1 *)((long)out[2] + 0xf) = uVar14;
  uVar1 = *(undefined1 *)((long)in[1] + 9);
  uVar2 = *(undefined1 *)((long)in[1] + 10);
  uVar3 = *(undefined1 *)((long)in[1] + 0xb);
  uVar4 = *(undefined1 *)((long)in[1] + 0xc);
  uVar5 = *(undefined1 *)((long)in[1] + 0xd);
  uVar6 = *(undefined1 *)((long)in[1] + 0xe);
  uVar7 = *(undefined1 *)((long)in[1] + 0xf);
  lVar15 = in[4][1];
  uVar8 = *(undefined1 *)((long)in[4] + 9);
  uVar9 = *(undefined1 *)((long)in[4] + 10);
  uVar10 = *(undefined1 *)((long)in[4] + 0xb);
  uVar11 = *(undefined1 *)((long)in[4] + 0xc);
  uVar12 = *(undefined1 *)((long)in[4] + 0xd);
  uVar13 = *(undefined1 *)((long)in[4] + 0xe);
  uVar14 = *(undefined1 *)((long)in[4] + 0xf);
  *(char *)out[3] = (char)in[1][1];
  *(char *)((long)out[3] + 1) = (char)lVar15;
  *(undefined1 *)((long)out[3] + 2) = uVar1;
  *(undefined1 *)((long)out[3] + 3) = uVar8;
  *(undefined1 *)((long)out[3] + 4) = uVar2;
  *(undefined1 *)((long)out[3] + 5) = uVar9;
  *(undefined1 *)((long)out[3] + 6) = uVar3;
  *(undefined1 *)((long)out[3] + 7) = uVar10;
  *(undefined1 *)(out[3] + 1) = uVar4;
  *(undefined1 *)((long)out[3] + 9) = uVar11;
  *(undefined1 *)((long)out[3] + 10) = uVar5;
  *(undefined1 *)((long)out[3] + 0xb) = uVar12;
  *(undefined1 *)((long)out[3] + 0xc) = uVar6;
  *(undefined1 *)((long)out[3] + 0xd) = uVar13;
  *(undefined1 *)((long)out[3] + 0xe) = uVar7;
  *(undefined1 *)((long)out[3] + 0xf) = uVar14;
  uVar1 = *(undefined1 *)((long)in[2] + 1);
  uVar2 = *(undefined1 *)((long)in[2] + 2);
  uVar3 = *(undefined1 *)((long)in[2] + 3);
  uVar4 = *(undefined1 *)((long)in[2] + 4);
  uVar5 = *(undefined1 *)((long)in[2] + 5);
  uVar6 = *(undefined1 *)((long)in[2] + 6);
  uVar7 = *(undefined1 *)((long)in[2] + 7);
  lVar15 = in[5][0];
  uVar8 = *(undefined1 *)((long)in[5] + 1);
  uVar9 = *(undefined1 *)((long)in[5] + 2);
  uVar10 = *(undefined1 *)((long)in[5] + 3);
  uVar11 = *(undefined1 *)((long)in[5] + 4);
  uVar12 = *(undefined1 *)((long)in[5] + 5);
  uVar13 = *(undefined1 *)((long)in[5] + 6);
  uVar14 = *(undefined1 *)((long)in[5] + 7);
  *(char *)out[4] = (char)in[2][0];
  *(char *)((long)out[4] + 1) = (char)lVar15;
  *(undefined1 *)((long)out[4] + 2) = uVar1;
  *(undefined1 *)((long)out[4] + 3) = uVar8;
  *(undefined1 *)((long)out[4] + 4) = uVar2;
  *(undefined1 *)((long)out[4] + 5) = uVar9;
  *(undefined1 *)((long)out[4] + 6) = uVar3;
  *(undefined1 *)((long)out[4] + 7) = uVar10;
  *(undefined1 *)(out[4] + 1) = uVar4;
  *(undefined1 *)((long)out[4] + 9) = uVar11;
  *(undefined1 *)((long)out[4] + 10) = uVar5;
  *(undefined1 *)((long)out[4] + 0xb) = uVar12;
  *(undefined1 *)((long)out[4] + 0xc) = uVar6;
  *(undefined1 *)((long)out[4] + 0xd) = uVar13;
  *(undefined1 *)((long)out[4] + 0xe) = uVar7;
  *(undefined1 *)((long)out[4] + 0xf) = uVar14;
  uVar1 = *(undefined1 *)((long)in[2] + 9);
  uVar2 = *(undefined1 *)((long)in[2] + 10);
  uVar3 = *(undefined1 *)((long)in[2] + 0xb);
  uVar4 = *(undefined1 *)((long)in[2] + 0xc);
  uVar5 = *(undefined1 *)((long)in[2] + 0xd);
  uVar6 = *(undefined1 *)((long)in[2] + 0xe);
  uVar7 = *(undefined1 *)((long)in[2] + 0xf);
  lVar15 = in[5][1];
  uVar8 = *(undefined1 *)((long)in[5] + 9);
  uVar9 = *(undefined1 *)((long)in[5] + 10);
  uVar10 = *(undefined1 *)((long)in[5] + 0xb);
  uVar11 = *(undefined1 *)((long)in[5] + 0xc);
  uVar12 = *(undefined1 *)((long)in[5] + 0xd);
  uVar13 = *(undefined1 *)((long)in[5] + 0xe);
  uVar14 = *(undefined1 *)((long)in[5] + 0xf);
  *(char *)out[5] = (char)in[2][1];
  *(char *)((long)out[5] + 1) = (char)lVar15;
  *(undefined1 *)((long)out[5] + 2) = uVar1;
  *(undefined1 *)((long)out[5] + 3) = uVar8;
  *(undefined1 *)((long)out[5] + 4) = uVar2;
  *(undefined1 *)((long)out[5] + 5) = uVar9;
  *(undefined1 *)((long)out[5] + 6) = uVar3;
  *(undefined1 *)((long)out[5] + 7) = uVar10;
  *(undefined1 *)(out[5] + 1) = uVar4;
  *(undefined1 *)((long)out[5] + 9) = uVar11;
  *(undefined1 *)((long)out[5] + 10) = uVar5;
  *(undefined1 *)((long)out[5] + 0xb) = uVar12;
  *(undefined1 *)((long)out[5] + 0xc) = uVar6;
  *(undefined1 *)((long)out[5] + 0xd) = uVar13;
  *(undefined1 *)((long)out[5] + 0xe) = uVar7;
  *(undefined1 *)((long)out[5] + 0xf) = uVar14;
  return;
}

Assistant:

static WEBP_INLINE void RGB24PackedToPlanarHelper_SSE2(
    const __m128i* const in /*in[6]*/, __m128i* const out /*out[6]*/) {
  out[0] = _mm_unpacklo_epi8(in[0], in[3]);
  out[1] = _mm_unpackhi_epi8(in[0], in[3]);
  out[2] = _mm_unpacklo_epi8(in[1], in[4]);
  out[3] = _mm_unpackhi_epi8(in[1], in[4]);
  out[4] = _mm_unpacklo_epi8(in[2], in[5]);
  out[5] = _mm_unpackhi_epi8(in[2], in[5]);
}